

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void ConvertARGBToY_SSE2(uint32_t *argb,uint8_t *y,int width)

{
  uint uVar1;
  int iVar2;
  undefined8 *puVar3;
  uint in_EDX;
  __m128i *in_RSI;
  long in_RDI;
  uint32_t p;
  __m128i rgb [6];
  __m128i Y1;
  __m128i Y0;
  int i;
  int max_width;
  __m128i *in_stack_ffffffffffffff60;
  uint32_t *in_stack_ffffffffffffff68;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  __m128i *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar4;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  
  uVar1 = in_EDX & 0xfffffff0;
  for (iVar4 = 0; iVar4 < (int)uVar1; iVar4 = iVar4 + 0x10) {
    RGB32PackedToPlanar_SSE2(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    ConvertRGBToY_SSE2(in_RSI,(__m128i *)CONCAT44(in_EDX,uVar1),
                       (__m128i *)CONCAT44(iVar4,in_stack_ffffffffffffffa8),
                       in_stack_ffffffffffffffa0);
    ConvertRGBToY_SSE2(in_RSI,(__m128i *)CONCAT44(in_EDX,uVar1),
                       (__m128i *)CONCAT44(iVar4,in_stack_ffffffffffffffa8),
                       in_stack_ffffffffffffffa0);
    puVar3 = (undefined8 *)((long)*in_RSI + (long)iVar4);
    local_28 = (short)local_68;
    sStack_26 = (short)((ulong)local_68 >> 0x10);
    sStack_24 = (short)((ulong)local_68 >> 0x20);
    sStack_22 = (short)((ulong)local_68 >> 0x30);
    sStack_20 = (short)in_stack_ffffffffffffffa0;
    sStack_1e = (short)((ulong)in_stack_ffffffffffffffa0 >> 0x10);
    sStack_1c = (short)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
    sStack_1a = (short)((ulong)in_stack_ffffffffffffffa0 >> 0x30);
    local_38 = (short)local_78;
    sStack_36 = (short)((ulong)local_78 >> 0x10);
    sStack_34 = (short)((ulong)local_78 >> 0x20);
    sStack_32 = (short)((ulong)local_78 >> 0x30);
    sStack_30 = (short)uStack_70;
    sStack_2e = (short)((ulong)uStack_70 >> 0x10);
    sStack_2c = (short)((ulong)uStack_70 >> 0x20);
    sStack_2a = (short)((ulong)uStack_70 >> 0x30);
    *puVar3 = CONCAT17((0 < sStack_1a) * (sStack_1a < 0x100) *
                       (char)((ulong)in_stack_ffffffffffffffa0 >> 0x30) - (0xff < sStack_1a),
                       CONCAT16((0 < sStack_1c) * (sStack_1c < 0x100) *
                                (char)((ulong)in_stack_ffffffffffffffa0 >> 0x20) -
                                (0xff < sStack_1c),
                                CONCAT15((0 < sStack_1e) * (sStack_1e < 0x100) *
                                         (char)((ulong)in_stack_ffffffffffffffa0 >> 0x10) -
                                         (0xff < sStack_1e),
                                         CONCAT14((0 < sStack_20) * (sStack_20 < 0x100) *
                                                  (char)in_stack_ffffffffffffffa0 -
                                                  (0xff < sStack_20),
                                                  CONCAT13((0 < sStack_22) * (sStack_22 < 0x100) *
                                                           (char)((ulong)local_68 >> 0x30) -
                                                           (0xff < sStack_22),
                                                           CONCAT12((0 < sStack_24) *
                                                                    (sStack_24 < 0x100) *
                                                                    (char)((ulong)local_68 >> 0x20)
                                                                    - (0xff < sStack_24),
                                                                    CONCAT11((0 < sStack_26) *
                                                                             (sStack_26 < 0x100) *
                                                                             (char)((ulong)local_68
                                                                                   >> 0x10) -
                                                                             (0xff < sStack_26),
                                                                             (0 < local_28) *
                                                                             (local_28 < 0x100) *
                                                                             (char)local_68 -
                                                                             (0xff < local_28)))))))
                      );
    puVar3[1] = CONCAT17((0 < sStack_2a) * (sStack_2a < 0x100) * (char)((ulong)uStack_70 >> 0x30) -
                         (0xff < sStack_2a),
                         CONCAT16((0 < sStack_2c) * (sStack_2c < 0x100) *
                                  (char)((ulong)uStack_70 >> 0x20) - (0xff < sStack_2c),
                                  CONCAT15((0 < sStack_2e) * (sStack_2e < 0x100) *
                                           (char)((ulong)uStack_70 >> 0x10) - (0xff < sStack_2e),
                                           CONCAT14((0 < sStack_30) * (sStack_30 < 0x100) *
                                                    (char)uStack_70 - (0xff < sStack_30),
                                                    CONCAT13((0 < sStack_32) * (sStack_32 < 0x100) *
                                                             (char)((ulong)local_78 >> 0x30) -
                                                             (0xff < sStack_32),
                                                             CONCAT12((0 < sStack_34) *
                                                                      (sStack_34 < 0x100) *
                                                                      (char)((ulong)local_78 >> 0x20
                                                                            ) - (0xff < sStack_34),
                                                                      CONCAT11((0 < sStack_36) *
                                                                               (sStack_36 < 0x100) *
                                                                               (char)((ulong)
                                                  local_78 >> 0x10) - (0xff < sStack_36),
                                                  (0 < local_38) * (local_38 < 0x100) *
                                                  (char)local_78 - (0xff < local_38))))))));
  }
  for (; iVar4 < (int)in_EDX; iVar4 = iVar4 + 1) {
    uVar1 = *(uint *)(in_RDI + (long)iVar4 * 4);
    iVar2 = VP8RGBToY(uVar1 >> 0x10 & 0xff,uVar1 >> 8 & 0xff,uVar1 & 0xff,0x8000);
    *(char *)((long)*in_RSI + (long)iVar4) = (char)iVar2;
  }
  return;
}

Assistant:

static void ConvertARGBToY_SSE2(const uint32_t* WEBP_RESTRICT argb,
                                uint8_t* WEBP_RESTRICT y, int width) {
  const int max_width = width & ~15;
  int i;
  for (i = 0; i < max_width; i += 16) {
    __m128i Y0, Y1, rgb[6];
    RGB32PackedToPlanar_SSE2(&argb[i], rgb);
    ConvertRGBToY_SSE2(&rgb[0], &rgb[2], &rgb[4], &Y0);
    ConvertRGBToY_SSE2(&rgb[1], &rgb[3], &rgb[5], &Y1);
    STORE_16(_mm_packus_epi16(Y0, Y1), y + i);
  }
  for (; i < width; ++i) {   // left-over
    const uint32_t p = argb[i];
    y[i] = VP8RGBToY((p >> 16) & 0xff, (p >> 8) & 0xff, (p >>  0) & 0xff,
                     YUV_HALF);
  }
}